

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void sha512(void *in,unsigned_long inlen,void *out)

{
  undefined1 local_f0 [8];
  sha512_state ctx;
  void *out_local;
  unsigned_long inlen_local;
  void *in_local;
  
  ctx.buf._120_8_ = out;
  sha512_init((sha512_state *)local_f0);
  sha512_process((sha512_state *)local_f0,(uchar *)in,inlen);
  sha512_done((sha512_state *)local_f0,(uchar *)ctx.buf._120_8_);
  return;
}

Assistant:

void sha512(const void *in, unsigned long inlen, void* out)
{
    struct sha512_state ctx;
    sha512_init(&ctx);
    sha512_process(&ctx, (const unsigned char*)in, inlen);
    sha512_done(&ctx, (unsigned char *)out);
}